

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O1

void upb::generator::WriteMiniTableMultipleSources
               (DefPoolPair *pools,FileDefPtr file,MiniTableOptions *options,Plugin *plugin)

{
  MessageDefPtr message;
  EnumDefPtr e;
  FieldDefPtr ext;
  MiniTableOptions *pMVar1;
  FileDefPtr file_00;
  FileDefPtr file_01;
  FileDefPtr file_02;
  pointer pEVar2;
  pointer pFVar3;
  int *in_R9;
  pointer pMVar4;
  string_view full_name;
  string_view content;
  string_view full_name_00;
  string_view content_00;
  string_view full_name_01;
  string_view content_01;
  string_view filename;
  string_view filename_00;
  string_view filename_01;
  Output output;
  int i;
  vector<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_> enums;
  vector<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_> extensions;
  vector<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_> messages;
  char *local_d0;
  Plugin *local_c8;
  char local_c0;
  undefined7 uStack_bf;
  char local_ac [4];
  string local_a8;
  Plugin *local_88;
  DefPoolPair *local_80;
  vector<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_> local_78;
  vector<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_> local_60;
  vector<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_> local_48;
  
  local_88 = plugin;
  local_80 = pools;
  SortedMessages(&local_48,file);
  SortedExtensions(&local_60,file);
  SortedEnums(&local_78,file,kClosedEnums);
  local_ac[0] = '\0';
  local_ac[1] = '\0';
  local_ac[2] = '\0';
  local_ac[3] = '\0';
  if (local_48.super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_48.super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pMVar4 = local_48.super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>.
             _M_impl.super__Vector_impl_data._M_start;
    do {
      message.ptr_ = pMVar4->ptr_;
      local_d0 = &local_c0;
      local_c8 = (Plugin *)0x0;
      local_c0 = '\0';
      WriteMiniTableSourceIncludes
                ((generator *)file.ptr_,(FileDefPtr)options,(MiniTableOptions *)&local_d0,
                 (Output *)plugin);
      pMVar1 = (MiniTableOptions *)&local_d0;
      anon_unknown_5::WriteMessage(message,local_80,options,(Output *)&local_d0);
      upb_MessageDef_FullName(message.ptr_);
      full_name._M_str = local_ac;
      full_name._M_len = (size_t)pMVar1;
      MultipleSourceFilename_abi_cxx11_(&local_a8,(generator *)file.ptr_,file_00,full_name,in_R9);
      content._M_str = local_d0;
      content._M_len = (size_t)local_c8;
      filename._M_str = local_a8._M_dataplus._M_p;
      filename._M_len = local_a8._M_string_length;
      plugin = local_c8;
      Plugin::AddOutputFile(local_88,filename,content);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
      if (local_d0 != &local_c0) {
        operator_delete(local_d0,CONCAT71(uStack_bf,local_c0) + 1);
      }
      pMVar4 = pMVar4 + 1;
    } while (pMVar4 != local_48.
                       super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_78.super__Vector_base<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_78.super__Vector_base<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pEVar2 = local_78.super__Vector_base<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      e.ptr_ = pEVar2->ptr_;
      local_d0 = &local_c0;
      local_c8 = (Plugin *)0x0;
      local_c0 = '\0';
      WriteMiniTableSourceIncludes
                ((generator *)file.ptr_,(FileDefPtr)options,(MiniTableOptions *)&local_d0,
                 (Output *)plugin);
      anon_unknown_5::WriteEnum(e,(Output *)&local_d0);
      upb_EnumDef_FullName(e.ptr_);
      full_name_00._M_str = local_ac;
      full_name_00._M_len = (size_t)plugin;
      MultipleSourceFilename_abi_cxx11_(&local_a8,(generator *)file.ptr_,file_01,full_name_00,in_R9)
      ;
      content_00._M_str = local_d0;
      content_00._M_len = (size_t)local_c8;
      filename_00._M_str = local_a8._M_dataplus._M_p;
      filename_00._M_len = local_a8._M_string_length;
      plugin = local_c8;
      Plugin::AddOutputFile(local_88,filename_00,content_00);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
      if (local_d0 != &local_c0) {
        operator_delete(local_d0,CONCAT71(uStack_bf,local_c0) + 1);
      }
      pEVar2 = pEVar2 + 1;
    } while (pEVar2 != local_78.
                       super__Vector_base<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_>._M_impl
                       .super__Vector_impl_data._M_finish);
  }
  if (local_60.super__Vector_base<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_60.super__Vector_base<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pFVar3 = local_60.super__Vector_base<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>.
             _M_impl.super__Vector_impl_data._M_start;
    do {
      ext.ptr_ = pFVar3->ptr_;
      local_d0 = &local_c0;
      local_c8 = (Plugin *)0x0;
      local_c0 = '\0';
      WriteMiniTableSourceIncludes
                ((generator *)file.ptr_,(FileDefPtr)options,(MiniTableOptions *)&local_d0,
                 (Output *)plugin);
      anon_unknown_5::WriteExtension(local_80,ext,(Output *)&local_d0);
      upb_FieldDef_FullName(ext.ptr_);
      full_name_01._M_str = local_ac;
      full_name_01._M_len = (size_t)plugin;
      MultipleSourceFilename_abi_cxx11_(&local_a8,(generator *)file.ptr_,file_02,full_name_01,in_R9)
      ;
      content_01._M_str = local_d0;
      content_01._M_len = (size_t)local_c8;
      filename_01._M_str = local_a8._M_dataplus._M_p;
      filename_01._M_len = local_a8._M_string_length;
      plugin = local_c8;
      Plugin::AddOutputFile(local_88,filename_01,content_01);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
      if (local_d0 != &local_c0) {
        operator_delete(local_d0,CONCAT71(uStack_bf,local_c0) + 1);
      }
      pFVar3 = pFVar3 + 1;
    } while (pFVar3 != local_60.
                       super__Vector_base<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_78.super__Vector_base<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_78.
                          super__Vector_base<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.
                          super__Vector_base<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_60.super__Vector_base<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_60.
                          super__Vector_base<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.
                          super__Vector_base<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_48.super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void WriteMiniTableMultipleSources(const DefPoolPair& pools,
                                   upb::FileDefPtr file,
                                   const MiniTableOptions& options,
                                   Plugin* plugin) {
  std::vector<upb::MessageDefPtr> messages = SortedMessages(file);
  std::vector<upb::FieldDefPtr> extensions = SortedExtensions(file);
  std::vector<upb::EnumDefPtr> enums = SortedEnums(file, kClosedEnums);
  int i = 0;

  for (auto message : messages) {
    Output output;
    WriteMiniTableSourceIncludes(file, options, output);
    WriteMessage(message, pools, options, output);
    plugin->AddOutputFile(MultipleSourceFilename(file, message.full_name(), &i),
                          output.output());
  }
  for (const auto e : enums) {
    Output output;
    WriteMiniTableSourceIncludes(file, options, output);
    WriteEnum(e, output);
    plugin->AddOutputFile(MultipleSourceFilename(file, e.full_name(), &i),
                          output.output());
  }
  for (const auto ext : extensions) {
    Output output;
    WriteMiniTableSourceIncludes(file, options, output);
    WriteExtension(pools, ext, output);
    plugin->AddOutputFile(MultipleSourceFilename(file, ext.full_name(), &i),
                          output.output());
  }
}